

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_obmc_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              FULLPEL_MV *best_mv)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  MV *pMVar7;
  int iVar8;
  ulong uVar9;
  int j;
  ulong uVar10;
  bool bVar11;
  FULLPEL_MV mv;
  FULLPEL_MV FVar12;
  FULLPEL_MV tmp_mv;
  int num00;
  int local_7c;
  undefined1 local_78 [16];
  FULLPEL_MOTION_SEARCH_PARAMS *local_68;
  ulong local_60;
  MV_COST_PARAMS *local_58;
  int32_t *local_50;
  int32_t *local_48;
  aom_variance_fn_ptr_t *local_40;
  FullMvLimits *local_38;
  
  if (ms_params->fast_obmc_search == 0) {
    psVar2 = ms_params->search_sites;
    num00 = 0;
    iVar4 = obmc_diamond_search_sad(ms_params,start_mv,&tmp_mv,step_param,&local_7c);
    local_78._0_4_ = 0x7fffffff;
    if (iVar4 != 0x7fffffff) {
      local_78._0_4_ = get_obmc_mvpred_var(ms_params,&tmp_mv);
    }
    *best_mv = tmp_mv;
    iVar4 = psVar2->num_search_steps;
    while (iVar8 = local_7c + 1, iVar6 = local_78._0_4_, local_7c < ~step_param + iVar4) {
      local_7c = iVar8;
      if (num00 == 0) {
        iVar6 = obmc_diamond_search_sad(ms_params,start_mv,&tmp_mv,step_param + iVar8,&num00);
        if ((iVar6 != 0x7fffffff) &&
           (iVar6 = get_obmc_mvpred_var(ms_params,&tmp_mv), iVar6 < (int)local_78._0_4_)) {
          *best_mv = tmp_mv;
          local_78._0_4_ = iVar6;
        }
      }
      else {
        num00 = num00 + -1;
      }
    }
  }
  else {
    *best_mv = start_mv;
    local_38 = &ms_params->mv_limits;
    clamp_fullmv(best_mv,local_38);
    local_40 = ms_params->vfp;
    pbVar1 = (ms_params->ms_buffers).ref;
    local_48 = (ms_params->ms_buffers).wsrc;
    local_50 = (ms_params->ms_buffers).obmc_mask;
    local_68 = ms_params;
    uVar3 = (*local_40->osdf)(pbVar1->buf +
                              (long)best_mv->col + (long)best_mv->row * (long)pbVar1->stride,
                              pbVar1->stride,local_48,local_50);
    local_58 = &ms_params->mv_cost_params;
    iVar4 = mvsad_err_cost_(best_mv,&ms_params->mv_cost_params);
    uVar3 = iVar4 + uVar3;
    uVar5 = 0;
    while( true ) {
      pMVar7 = av1_int_pro_motion_estimation::search_pos;
      if (uVar5 == 8) break;
      uVar9 = 0xffffffffffffffff;
      local_60 = (ulong)uVar5;
      for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
        mv.row = (*pMVar7).row + (*best_mv).row;
        mv.col = (*pMVar7).col + (*best_mv).col;
        local_78 = ZEXT416((uint)mv);
        tmp_mv = mv;
        iVar4 = av1_is_fullmv_in_range(local_38,mv);
        if (iVar4 != 0) {
          uVar5 = (*local_40->osdf)(pbVar1->buf +
                                    ((int)(short)local_78._2_2_ + (int)mv.row * pbVar1->stride),
                                    pbVar1->stride,local_48,local_50);
          if (uVar5 < uVar3) {
            iVar4 = mvsad_err_cost_(&tmp_mv,local_58);
            uVar5 = iVar4 + uVar5;
            bVar11 = uVar5 < uVar3;
            if (bVar11) {
              uVar3 = uVar5;
            }
            uVar9 = uVar9 & 0xffffffff;
            if (bVar11) {
              uVar9 = uVar10 & 0xffffffff;
            }
          }
        }
        pMVar7 = pMVar7 + 1;
      }
      if ((int)uVar9 == -1) break;
      FVar12.row = (*best_mv).row + av1_int_pro_motion_estimation::search_pos[(int)uVar9].row;
      FVar12.col = (*best_mv).col + av1_int_pro_motion_estimation::search_pos[(int)uVar9].col;
      *best_mv = FVar12;
      uVar5 = (int)local_60 + 1;
    }
    iVar6 = 0x7fffffff;
    if (uVar3 != 0x7fffffff) {
      iVar4 = get_obmc_mvpred_var(local_68,best_mv);
      return iVar4;
    }
  }
  return iVar6;
}

Assistant:

int av1_obmc_full_pixel_search(const FULLPEL_MV start_mv,
                               const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                               const int step_param, FULLPEL_MV *best_mv) {
  if (!ms_params->fast_obmc_search) {
    const int bestsme =
        obmc_full_pixel_diamond(ms_params, start_mv, step_param, best_mv);
    return bestsme;
  } else {
    *best_mv = start_mv;
    clamp_fullmv(best_mv, &ms_params->mv_limits);
    int thissme = obmc_refining_search_sad(ms_params, best_mv);
    if (thissme < INT_MAX) thissme = get_obmc_mvpred_var(ms_params, best_mv);
    return thissme;
  }
}